

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ArrayXd __thiscall ChebTools::MonomialCoefficients::calc_coeffs(MonomialCoefficients *this,int n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int in_EDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar4;
  int __exponent;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  ArrayXd AVar9;
  
  (this->store)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->store)._M_h._M_bucket_count = 0;
  if (in_EDX < -1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Array<double, -1, 1>>::resize(Index) [Derived = Eigen::Array<double, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)this,(ulong)(in_EDX + 1),(ulong)(in_EDX + 1),1);
  dVar7 = (double)in_EDX;
  dVar1 = floor(dVar7 * 0.5);
  dVar8 = 0.0;
  IVar4 = extraout_RDX;
  if (0.0 <= dVar1) {
    lVar6 = (long)in_EDX;
    __exponent = in_EDX + -1;
    iVar5 = 1;
    do {
      dVar2 = pow(-1.0,dVar8);
      dVar3 = ldexp(1.0,__exponent);
      if ((lVar6 < 0) || ((long)(this->store)._M_h._M_bucket_count <= lVar6)) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<double, -1, 1>, Level = 1]"
                     );
      }
      dVar8 = binomialCoefficient((double)in_EDX,dVar8);
      (this->store)._M_h._M_buckets[lVar6] =
           (__node_base_ptr)(((dVar2 * dVar3 * dVar7) / (double)in_EDX) * dVar8);
      dVar8 = (double)iVar5;
      in_EDX = in_EDX + -1;
      __exponent = __exponent + -2;
      lVar6 = lVar6 + -2;
      iVar5 = iVar5 + 1;
      IVar4 = extraout_RDX_00;
    } while (dVar8 <= dVar1);
  }
  AVar9.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar4;
  AVar9.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ArrayXd)AVar9.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::MatrixXd ChebyshevExpansion::companion_matrix(const Eigen::VectorXd &coeffs) const {
        Eigen::VectorXd new_mc = reduce_zeros(coeffs);
        return companion_matrix_noreduce(new_mc);
    }